

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astFunctionSignature *
new_function_signature
          (Context_conflict *ctx,MOJOSHADER_astDataType *dt,char *identifier,
          MOJOSHADER_astFunctionParameters *params)

{
  MOJOSHADER_astFunctionSignature *retval;
  MOJOSHADER_astFunctionParameters *params_local;
  char *identifier_local;
  MOJOSHADER_astDataType *dt_local;
  Context_conflict *ctx_local;
  
  ctx_local = (Context_conflict *)Malloc(ctx,0x40);
  if (ctx_local == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx_local->isfail = 0x55;
    ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
    *(uint *)&ctx_local->free = ctx->sourceline;
    ctx_local->malloc_data = dt;
    ctx_local->errors = (ErrorList *)identifier;
    ctx_local->warnings = (ErrorList *)params;
    *(undefined4 *)&ctx_local->strcache = 0;
    ctx_local->sourcefile = (char *)0x0;
  }
  return (MOJOSHADER_astFunctionSignature *)ctx_local;
}

Assistant:

static MOJOSHADER_astFunctionSignature *new_function_signature(Context *ctx,
                                    const MOJOSHADER_astDataType *dt,
                                    const char *identifier,
                                    MOJOSHADER_astFunctionParameters *params)
{
    NEW_AST_NODE(retval, MOJOSHADER_astFunctionSignature,
                 MOJOSHADER_AST_FUNCTION_SIGNATURE);
    retval->datatype = dt;
    retval->identifier = identifier;
    retval->params = params;
    retval->storage_class = MOJOSHADER_AST_FNSTORECLS_NONE;
    retval->semantic = NULL;
    return retval;
}